

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:561:57)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:561:57)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  value *pvVar4;
  undefined8 *puVar5;
  uint *puVar6;
  object *this_00;
  long *plVar7;
  long *plVar8;
  uint32_t index;
  undefined8 extraout_RDX;
  undefined8 uVar9;
  undefined8 extraout_RDX_00;
  uint uVar10;
  anon_class_16_1_570cf4e1_for_f *this_01;
  anon_union_32_5_7b1e0779_for_value_3 *this_02;
  string last_idx;
  string this_idx;
  undefined1 local_c0 [40];
  undefined1 local_98 [16];
  value *local_88;
  uint32_t local_7c;
  wstring_view local_78;
  ulong local_68;
  gc_heap_ptr_untyped *local_60;
  gc_heap *local_58;
  wstring_view local_50;
  
  this_01 = &this->f;
  local_88 = __return_storage_ptr__;
  pvVar4 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar4);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  if (this_->type_ == object) {
    this_02 = &this_->field_1;
    local_58 = (this_01->global).super_gc_heap_ptr_untyped.heap_;
    local_60 = (gc_heap_ptr_untyped *)this_01;
    puVar5 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
    local_98._0_8_ = (gc_heap *)0x6;
    local_98._8_8_ = L"length";
    (**(code **)*puVar5)((value *)local_c0);
    uVar3 = to_uint32((value *)local_c0);
    value::destroy((value *)local_c0);
    if (uVar3 == 0) {
      plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
      plVar8 = (long *)gc_heap_ptr_untyped::get(local_60);
      (**(code **)(*plVar8 + 0x98))(local_98,plVar8,"length");
      local_c0._0_4_ = number;
      local_c0._8_8_ = 0.0;
      (**(code **)(*plVar7 + 8))(plVar7,local_98,local_c0,0);
      value::destroy((value *)local_c0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
      pvVar4 = local_88;
      value::value(local_88,(value *)&value::undefined);
    }
    else {
      index_string_abi_cxx11_((wstring *)local_c0,(mjs *)0x0,index);
      local_78._M_len = local_c0._8_8_;
      local_78._M_str = (wchar_t *)local_c0._0_8_;
      string::string((string *)local_98,local_58,&local_78);
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ * 4 + 4);
      }
      puVar5 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
      puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
      local_c0._8_8_ = puVar6 + 1;
      local_c0._0_8_ = ZEXT48(*puVar6);
      (**(code **)*puVar5)(local_88,puVar5);
      local_68 = (ulong)uVar3;
      if (uVar3 != 1) {
        local_7c = 2;
        if (2 < uVar3) {
          local_7c = uVar3;
        }
        uVar10 = 1;
        uVar9 = extraout_RDX;
        do {
          index_string_abi_cxx11_((wstring *)local_c0,(mjs *)(ulong)uVar10,(uint32_t)uVar9);
          local_50._M_len = local_c0._8_8_;
          local_50._M_str = (wchar_t *)local_c0._0_8_;
          string::string((string *)&local_78,local_58,&local_50);
          if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
            operator_delete((void *)local_c0._0_8_,local_c0._16_8_ * 4 + 4);
          }
          this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
          puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_78);
          local_c0._8_8_ = puVar6 + 1;
          local_c0._0_8_ = ZEXT48(*puVar6);
          bVar2 = object::has_property(this_00,(wstring_view *)local_c0);
          if (bVar2) {
            plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
            puVar5 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
            puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_78);
            local_50._M_str = (wchar_t *)(puVar6 + 1);
            local_50._M_len = (size_t)*puVar6;
            (**(code **)*puVar5)((value *)local_c0,puVar5,&local_50);
            (**(code **)(*plVar7 + 8))(plVar7,local_98,(value *)local_c0,0);
            value::destroy((value *)local_c0);
          }
          else {
            plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
            puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
            local_c0._8_8_ = puVar6 + 1;
            local_c0._0_8_ = ZEXT48(*puVar6);
            (**(code **)(*plVar7 + 0x10))(plVar7,(value *)local_c0);
          }
          gc_heap_ptr_untyped::operator=
                    ((gc_heap_ptr_untyped *)local_98,(gc_heap_ptr_untyped *)&local_78);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_78);
          uVar10 = uVar10 + 1;
          uVar9 = extraout_RDX_00;
        } while (local_7c != uVar10);
      }
      plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
      plVar8 = (long *)gc_heap_ptr_untyped::get(local_60);
      uVar1 = local_68;
      (**(code **)(*plVar8 + 0x98))(&local_78,plVar8,"length");
      local_c0._8_8_ = (undefined8)((int)uVar1 - 1);
      local_c0._0_4_ = number;
      (**(code **)(*plVar7 + 8))(plVar7,&local_78,local_c0,0);
      value::destroy((value *)local_c0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_78);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
      pvVar4 = local_88;
    }
    return pvVar4;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }